

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  int extraout_EAX;
  mount_point *in_stack_ffffffffffffffb0;
  char local_40 [16];
  mount_point *in_stack_ffffffffffffffd0;
  char local_18 [8];
  char *local_10;
  applications_pool *local_8;
  
  local_10 = __special_file;
  local_8 = this;
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffffb0,
             (intrusive_ptr<cppcms::application> *)this);
  mount_point::mount_point(in_stack_ffffffffffffffd0);
  mount(this,local_18,local_40,__fstype,__rwflag,__data);
  mount_point::~mount_point(in_stack_ffffffffffffffb0);
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffffb0);
  return extraout_EAX;
}

Assistant:

void applications_pool::mount(booster::intrusive_ptr<application> app)
{
	mount(app,mount_point());
}